

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O0

void __thiscall
duckdb::ReservoirQuantileState<duckdb::hugeint_t>::FillReservoir
          (ReservoirQuantileState<duckdb::hugeint_t> *this,idx_t sample_size,hugeint_t element)

{
  uint64_t uVar1;
  idx_t in_RCX;
  idx_t *piVar2;
  idx_t in_RDX;
  ReservoirQuantileState<duckdb::hugeint_t> *in_RSI;
  hugeint_t *in_RDI;
  BaseReservoirSampling *unaff_retaddr;
  
  if ((ReservoirQuantileState<duckdb::hugeint_t> *)in_RDI[1].lower < in_RSI) {
    uVar1 = in_RDI[1].lower;
    in_RDI[1].lower = uVar1 + 1;
    piVar2 = (idx_t *)(in_RDI->lower + uVar1 * 0x10);
    *piVar2 = in_RDX;
    piVar2[1] = in_RCX;
    BaseReservoirSampling::InitializeReservoirWeights(unaff_retaddr,in_RCX,in_RDX);
  }
  else if (*(long *)(in_RDI[1].upper + 0x30) == *(long *)(in_RDI[1].upper + 0x48)) {
    ReplaceElement(in_RSI,in_RDI);
  }
  return;
}

Assistant:

void FillReservoir(idx_t sample_size, T element) {
		if (pos < sample_size) {
			v[pos++] = element;
			r_samp->InitializeReservoirWeights(pos, len);
		} else {
			D_ASSERT(r_samp->next_index_to_sample >= r_samp->num_entries_to_skip_b4_next_sample);
			if (r_samp->next_index_to_sample == r_samp->num_entries_to_skip_b4_next_sample) {
				ReplaceElement(element);
			}
		}
	}